

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_function_call
          (t_cpp_generator *this,ostream *out,t_function *tfunction,string *target,string *iface,
          string *arg_prefix)

{
  t_struct *ptVar1;
  bool bVar2;
  int iVar3;
  t_type *ttype;
  ostream *poVar4;
  pointer pptVar5;
  string local_50;
  
  ttype = t_type::get_true_type(tfunction->returntype_);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  std::operator<<(out,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  poVar4 = out;
  if ((tfunction->oneway_ == false) &&
     (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype), (char)iVar3 == '\0')) {
    bVar2 = is_complex_type(this,ttype);
    if (bVar2) {
      poVar4 = std::operator<<(out,(string *)iface);
      poVar4 = std::operator<<(poVar4,"->");
      poVar4 = std::operator<<(poVar4,(string *)&tfunction->name_);
      poVar4 = std::operator<<(poVar4,"(");
      std::operator<<(poVar4,(string *)target);
      bVar2 = false;
      goto LAB_001806fc;
    }
    poVar4 = std::operator<<(out,(string *)target);
    poVar4 = std::operator<<(poVar4," = ");
  }
  poVar4 = std::operator<<(poVar4,(string *)iface);
  poVar4 = std::operator<<(poVar4,"->");
  poVar4 = std::operator<<(poVar4,(string *)&tfunction->name_);
  std::operator<<(poVar4,"(");
  bVar2 = true;
LAB_001806fc:
  ptVar1 = tfunction->arglist_;
  for (pptVar5 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar5 !=
      (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
    if (!bVar2) {
      std::operator<<(out,", ");
    }
    poVar4 = std::operator<<(out,(string *)arg_prefix);
    std::operator<<(poVar4,(string *)&(*pptVar5)->name_);
    bVar2 = false;
  }
  poVar4 = std::operator<<(out,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_cpp_generator::generate_function_call(ostream& out,
                                             t_function* tfunction,
                                             string target,
                                             string iface,
                                             string arg_prefix) {
  bool first = true;
  t_type* ret_type = get_true_type(tfunction->get_returntype());
  out << indent();
  if (!tfunction->is_oneway() && !ret_type->is_void()) {
    if (is_complex_type(ret_type)) {
      first = false;
      out << iface << "->" << tfunction->get_name() << "(" << target;
    } else {
      out << target << " = " << iface << "->" << tfunction->get_name() << "(";
    }
  } else {
    out << iface << "->" << tfunction->get_name() << "(";
  }
  const std::vector<t_field*>& fields = tfunction->get_arglist()->get_members();
  vector<t_field*>::const_iterator f_iter;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
    } else {
      out << ", ";
    }
    out << arg_prefix << (*f_iter)->get_name();
  }
  out << ");" << endl;
}